

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O0

void __thiscall cmStateSnapshot::SetDefaultDefinitions(cmStateSnapshot *this)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  uint uVar2;
  char *__str;
  PointerType pSVar3;
  PointerType pBVar4;
  allocator<char> local_3c9;
  string local_3c8;
  string_view local_3a8;
  allocator<char> local_391;
  string local_390;
  string_view local_370;
  allocator<char> local_359;
  string local_358;
  string local_338;
  string_view local_318;
  allocator<char> local_301;
  string local_300;
  string local_2e0;
  string_view local_2c0;
  allocator<char> local_2a9;
  string local_2a8;
  string local_288;
  string_view local_268;
  allocator<char> local_251;
  string local_250;
  string local_230;
  string_view local_210;
  allocator<char> local_1f9;
  string local_1f8;
  string_view local_1d8;
  allocator<char> local_1c1;
  string local_1c0;
  string_view local_1a0;
  allocator<char> local_189;
  string local_188;
  string_view local_168;
  allocator<char> local_151;
  string local_150;
  string_view local_130;
  allocator<char> local_119;
  string local_118;
  string_view local_f8;
  allocator<char> local_e1;
  string local_e0;
  string_view local_c0;
  allocator<char> local_a9;
  string local_a8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_88;
  size_t local_78;
  char *local_70;
  size_t local_68;
  size_t sStack_60;
  allocator<char> local_41;
  string local_40;
  undefined1 auStack_20 [8];
  string_view hostSystemName;
  cmStateSnapshot *this_local;
  
  hostSystemName._M_str = (char *)this;
  _auStack_20 = cmSystemTools::GetSystemName();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_HOST_SYSTEM_NAME",&local_41);
  local_68 = (size_t)auStack_20;
  sStack_60 = hostSystemName._M_len;
  SetDefinition(this,&local_40,_auStack_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_78 = (size_t)auStack_20;
  local_70 = (char *)hostSystemName._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"Windows");
  __x._M_str = local_70;
  __x._M_len = local_78;
  bVar1 = std::operator==(__x,local_88);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"WIN32",&local_a9);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c0,"1");
    SetDefinition(this,&local_a8,local_c0);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"CMAKE_HOST_WIN32",&local_e1);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f8,"1");
    SetDefinition(this,&local_e0,local_f8);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"UNIX",&local_119);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_130,"1");
    SetDefinition(this,&local_118,local_130);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"CMAKE_HOST_UNIX",&local_151);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_168,"1");
    SetDefinition(this,&local_150,local_168);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator(&local_151);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"LINUX",&local_189);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1a0,"1");
  SetDefinition(this,&local_188,local_1a0);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"CMAKE_HOST_LINUX",&local_1c1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d8,"1");
  SetDefinition(this,&local_1c0,local_1d8);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"CMAKE_MAJOR_VERSION",&local_1f9);
  uVar2 = cmVersion::GetMajorVersion();
  std::__cxx11::to_string(&local_230,uVar2);
  local_210 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_230);
  SetDefinition(this,&local_1f8,local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"CMAKE_MINOR_VERSION",&local_251);
  uVar2 = cmVersion::GetMinorVersion();
  std::__cxx11::to_string(&local_288,uVar2);
  local_268 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_288);
  SetDefinition(this,&local_250,local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"CMAKE_PATCH_VERSION",&local_2a9);
  uVar2 = cmVersion::GetPatchVersion();
  std::__cxx11::to_string(&local_2e0,uVar2);
  local_2c0 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2e0);
  SetDefinition(this,&local_2a8,local_2c0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"CMAKE_TWEAK_VERSION",&local_301);
  uVar2 = cmVersion::GetTweakVersion();
  std::__cxx11::to_string(&local_338,uVar2);
  local_318 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_338);
  SetDefinition(this,&local_300,local_318);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,"CMAKE_VERSION",&local_359);
  __str = cmVersion::GetCMakeVersion();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_370,__str);
  SetDefinition(this,&local_358,local_370);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator(&local_359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"CMAKE_FILES_DIRECTORY",&local_391);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3a8,"/CMakeFiles")
  ;
  SetDefinition(this,&local_390,local_3a8);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator(&local_391);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"INCLUDE_REGULAR_EXPRESSION",&local_3c9);
  cmPropertyMap::SetProperty(&pBVar4->Properties,&local_3c8,"^.*$");
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  return;
}

Assistant:

void cmStateSnapshot::SetDefaultDefinitions()
{
  /* Up to CMake 2.4 here only WIN32, UNIX and APPLE were set.
    With CMake must separate between target and host platform. In most cases
    the tests for WIN32, UNIX and APPLE will be for the target system, so an
    additional set of variables for the host system is required ->
    CMAKE_HOST_WIN32, CMAKE_HOST_UNIX, CMAKE_HOST_APPLE.
    WIN32, UNIX and APPLE are now set in the platform files in
    Modules/Platforms/.
    To keep cmake scripts (-P) and custom language and compiler modules
    working, these variables are still also set here in this place, but they
    will be reset in CMakeSystemSpecificInformation.cmake before the platform
    files are executed. */
  cm::string_view hostSystemName = cmSystemTools::GetSystemName();
  this->SetDefinition("CMAKE_HOST_SYSTEM_NAME", hostSystemName);
  if (hostSystemName == "Windows") {
    this->SetDefinition("WIN32", "1");
    this->SetDefinition("CMAKE_HOST_WIN32", "1");
  } else {
    this->SetDefinition("UNIX", "1");
    this->SetDefinition("CMAKE_HOST_UNIX", "1");
  }
#if defined(__CYGWIN__)
  std::string legacy;
  if (cmSystemTools::GetEnv("CMAKE_LEGACY_CYGWIN_WIN32", legacy) &&
      cmIsOn(legacy)) {
    this->SetDefinition("WIN32", "1");
    this->SetDefinition("CMAKE_HOST_WIN32", "1");
  }
#endif
#if defined(__APPLE__)
  this->SetDefinition("APPLE", "1");
  this->SetDefinition("CMAKE_HOST_APPLE", "1");
#endif
#if defined(__sun__)
  this->SetDefinition("CMAKE_HOST_SOLARIS", "1");
#endif

#if defined(__OpenBSD__)
  this->SetDefinition("BSD", "OpenBSD");
  this->SetDefinition("CMAKE_HOST_BSD", "OpenBSD");
#elif defined(__FreeBSD__)
  this->SetDefinition("BSD", "FreeBSD");
  this->SetDefinition("CMAKE_HOST_BSD", "FreeBSD");
#elif defined(__NetBSD__)
  this->SetDefinition("BSD", "NetBSD");
  this->SetDefinition("CMAKE_HOST_BSD", "NetBSD");
#elif defined(__DragonFly__)
  this->SetDefinition("BSD", "DragonFlyBSD");
  this->SetDefinition("CMAKE_HOST_BSD", "DragonFlyBSD");
#endif

#if defined(__linux__)
  this->SetDefinition("LINUX", "1");
  this->SetDefinition("CMAKE_HOST_LINUX", "1");
#endif

  this->SetDefinition("CMAKE_MAJOR_VERSION",
                      std::to_string(cmVersion::GetMajorVersion()));
  this->SetDefinition("CMAKE_MINOR_VERSION",
                      std::to_string(cmVersion::GetMinorVersion()));
  this->SetDefinition("CMAKE_PATCH_VERSION",
                      std::to_string(cmVersion::GetPatchVersion()));
  this->SetDefinition("CMAKE_TWEAK_VERSION",
                      std::to_string(cmVersion::GetTweakVersion()));
  this->SetDefinition("CMAKE_VERSION", cmVersion::GetCMakeVersion());

  this->SetDefinition("CMAKE_FILES_DIRECTORY", "/CMakeFiles");

  // Setup the default include file regular expression (match everything).
  this->Position->BuildSystemDirectory->Properties.SetProperty(
    "INCLUDE_REGULAR_EXPRESSION", "^.*$");
}